

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_rawseti(lua_State *L,int idx,lua_Integer n)

{
  Table *t;
  TValue *pTVar1;
  long lVar2;
  
  pTVar1 = index2value(L,idx);
  t = (Table *)(pTVar1->value_).gc;
  luaH_setint(L,t,n,(TValue *)((L->top).offset + -0x10));
  lVar2 = (L->top).offset;
  if ((((*(byte *)(lVar2 + -8) & 0x40) != 0) && ((t->marked & 0x20) != 0)) &&
     ((*(byte *)(*(long *)(lVar2 + -0x10) + 9) & 0x18) != 0)) {
    luaC_barrierback_(L,(GCObject *)t);
    lVar2 = (L->top).offset;
  }
  (L->top).p = (StkId)(lVar2 + -0x10);
  return;
}

Assistant:

LUA_API void lua_rawseti (lua_State *L, int idx, lua_Integer n) {
  Table *t;
  lua_lock(L);
  api_checknelems(L, 1);
  t = gettable(L, idx);
  luaH_setint(L, t, n, s2v(L->top.p - 1));
  luaC_barrierback(L, obj2gco(t), s2v(L->top.p - 1));
  L->top.p--;
  lua_unlock(L);
}